

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool SearchPolylinePart(ON_RTreeNode *a_node,ON_Polyline *polyline,int from,int plcount,
                       ON_RTreeSearchPolylineResultCallback *result)

{
  bool bVar1;
  ON_3dPoint *pOVar2;
  ON_Line *line_1;
  ON_Line *line;
  ON_BoundingBox local_80;
  ON_RTreeBBox *local_50;
  ON_BoundingBox *bb;
  ON_RTreeBranch *branch;
  int local_38;
  int innercount;
  int count;
  int i;
  ON_RTreeSearchPolylineResultCallback *result_local;
  int plcount_local;
  int from_local;
  ON_Polyline *polyline_local;
  ON_RTreeNode *a_node_local;
  
  _count = result;
  result_local._0_4_ = plcount;
  result_local._4_4_ = from;
  _plcount_local = (ON_SimpleArray<ON_3dPoint> *)polyline;
  polyline_local = (ON_Polyline *)a_node;
  if (plcount < 3) {
    if (plcount == 2) {
      pOVar2 = ON_SimpleArray<ON_3dPoint>::Array((ON_SimpleArray<ON_3dPoint> *)polyline);
      if ((_count->super_ON_RTreeSearchResultCallback).m_context != (void *)0x0) {
        *(int *)(_count->super_ON_RTreeSearchResultCallback).m_context = result_local._4_4_;
      }
      bVar1 = SearchHelper((ON_RTreeNode *)polyline_local,(ON_Line *)(pOVar2 + result_local._4_4_),
                           &_count->super_ON_RTreeSearchResultCallback);
      return bVar1;
    }
    if (plcount < 2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0x4bd,"","Unexpected plcount");
      return true;
    }
  }
  else {
    local_38 = a_node->m_count;
    if (0 < local_38) {
      bb = (ON_BoundingBox *)a_node->m_branch;
      bVar1 = ON_RTreeNode::IsInternalNode(a_node);
      if (bVar1) {
        branch._4_4_ = ((int)result_local + 1) / 2;
        local_50 = (ON_RTreeBBox *)ON_Workspace::GetMemory(_count->m_ws,0x60);
        ON_3dPointArray::BoundingBox
                  (&local_80,(ON_3dPointArray *)_plcount_local,result_local._4_4_,branch._4_4_);
        memcpy(local_50,&local_80,0x30);
        ON_3dPointArray::BoundingBox
                  ((ON_BoundingBox *)&line,(ON_3dPointArray *)_plcount_local,
                   result_local._4_4_ + branch._4_4_ + -1,((int)result_local - branch._4_4_) + 1);
        memcpy(local_50 + 1,&line,0x30);
        for (innercount = 0; innercount < local_38; innercount = innercount + 1) {
          bVar1 = OverlapHelper(local_50,(ON_RTreeBBox *)((long)bb + (long)innercount * 0x38));
          if ((bVar1) &&
             (bVar1 = SearchPolylinePart(*(ON_RTreeNode **)
                                          ((long)bb + (long)innercount * 0x38 + 0x30),
                                         (ON_Polyline *)_plcount_local,result_local._4_4_,
                                         branch._4_4_,_count), !bVar1)) {
            return false;
          }
          bVar1 = OverlapHelper(local_50 + 1,(ON_RTreeBBox *)((long)bb + (long)innercount * 0x38));
          if ((bVar1) &&
             (bVar1 = SearchPolylinePart(*(ON_RTreeNode **)
                                          ((long)bb + (long)innercount * 0x38 + 0x30),
                                         (ON_Polyline *)_plcount_local,
                                         result_local._4_4_ + branch._4_4_ + -1,
                                         ((int)result_local - branch._4_4_) + 1,_count), !bVar1)) {
            return false;
          }
        }
      }
      else {
        for (innercount = 0; innercount < local_38; innercount = innercount + 1) {
          for (branch._4_4_ = 0; branch._4_4_ < (int)result_local + -1;
              branch._4_4_ = branch._4_4_ + 1) {
            pOVar2 = ON_SimpleArray<ON_3dPoint>::Array(_plcount_local);
            bVar1 = OverlapLineHelper((ON_Line *)(pOVar2 + (branch._4_4_ + result_local._4_4_)),
                                      (ON_RTreeBBox *)((long)bb + (long)innercount * 0x38));
            if (bVar1) {
              if ((_count->super_ON_RTreeSearchResultCallback).m_context != (void *)0x0) {
                *(int *)(_count->super_ON_RTreeSearchResultCallback).m_context =
                     branch._4_4_ + result_local._4_4_;
              }
              bVar1 = (*(_count->super_ON_RTreeSearchResultCallback).m_resultCallback)
                                ((_count->super_ON_RTreeSearchResultCallback).m_context,
                                 *(ON__INT_PTR *)((long)bb + (long)innercount * 0x38 + 0x30));
              if (!bVar1) {
                return false;
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static bool SearchPolylinePart(const ON_RTreeNode* a_node, const ON_Polyline* polyline, int from, int plcount,
  ON_RTreeSearchPolylineResultCallback& result)
{
  if (plcount > 2)
  {
    int i, count, innercount;

    if ((count = a_node->m_count) > 0)
    {
      const ON_RTreeBranch* branch = a_node->m_branch;
      if (a_node->IsInternalNode())
      {
        innercount = (plcount + 1) / 2;
        auto bb = (ON_BoundingBox*)result.m_ws->GetMemory(sizeof(ON_BoundingBox) * 2);
        *bb = polyline->BoundingBox(from, innercount);
        *(bb + 1) = polyline->BoundingBox(from + innercount - 1, plcount - innercount + 1);

        for (i = 0; i < count; ++i)
        {
          if (OverlapHelper((ON_RTreeBBox*)bb, &branch[i].m_rect))
          {
            if (!SearchPolylinePart(branch[i].m_child, polyline, from, innercount, result))
            {
              return false; // Don't continue searching
            }
          }
          if (OverlapHelper((ON_RTreeBBox*)bb+1, &branch[i].m_rect))
          {
            if (!SearchPolylinePart(branch[i].m_child, polyline, from + innercount - 1, plcount - innercount + 1, result))
            {
              return false; // Don't continue searching
            }
          }
        }
      }
      else
      {
        // a_node is a leaf node
        for (i = 0; i < count; ++i)
        {
          for (innercount = 0; innercount < (plcount-1); innercount++)
          {
            ON_Line* line = (ON_Line*)(&polyline->Array()[innercount + from]);
            if (OverlapLineHelper(line, &branch[i].m_rect))
            {
              if (result.m_context) ((ON_RTreePolylineContext*)result.m_context)->m_polyline_pointindex = innercount + from;
              if (!result.m_resultCallback(result.m_context, branch[i].m_id))
              {
                // callback canceled search
                return false;
              }
            }
          }
        }
      }
    }
  }
  else if (plcount == 2)
  {
    ON_Line* line = (ON_Line*)(&polyline->Array()[from]);
    if (result.m_context) ((ON_RTreePolylineContext*)result.m_context)->m_polyline_pointindex = from;
    return SearchHelper(a_node, line, result);
  }
  else if (plcount < 2)
  {
    ON_ERROR("Unexpected plcount");
    return true;
  }

  return true;
}